

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
PS2KeyboardSimulationDataGenerator::SendPrintScreenKey(PS2KeyboardSimulationDataGenerator *this)

{
  SendByte(this,0xe0);
  SendByte(this,'\x12');
  SendByte(this,0xe0);
  SendByte(this,'|');
  SendByte(this,0xe0);
  SendByte(this,0xf0);
  SendByte(this,'|');
  SendByte(this,0xe0);
  SendByte(this,0xf0);
  SendByte(this,'\x12');
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::SendPrintScreenKey()
{
    // make
    SendByte( 0xE0 );
    SendByte( 0x12 );
    SendByte( 0xE0 );
    SendByte( 0x7C );

    // break
    SendByte( 0xE0 );
    SendByte( 0xF0 );
    SendByte( 0x7C );
    SendByte( 0xE0 );
    SendByte( 0xF0 );
    SendByte( 0x12 );
}